

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infcover.c
# Opt level: O0

void cover_wrap(void)

{
  uchar dict [257];
  zng_stream copy;
  zng_stream strm;
  int ret;
  undefined1 auStackY_1e8 [8];
  zng_stream *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe38;
  zng_stream *in_stack_fffffffffffffe40;
  undefined1 local_d8 [48];
  int in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  zng_stream local_70;
  int local_4;
  
  local_4 = zng_inflate(0,0);
  if (local_4 != -2) {
    __assert_fail("ret == Z_STREAM_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x187,"void cover_wrap(void)");
  }
  local_4 = zng_inflateEnd(0);
  if (local_4 != -2) {
    __assert_fail("ret == Z_STREAM_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x188,"void cover_wrap(void)");
  }
  local_4 = zng_inflateCopy(0);
  if (local_4 != -2) {
    __assert_fail("ret == Z_STREAM_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x189,"void cover_wrap(void)");
  }
  fputs("inflate bad parameters\n",_stderr);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  inf(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
      in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  mem_setup(in_stack_fffffffffffffe20);
  local_70.avail_in = 0;
  local_70.next_in = (uint8_t *)0x0;
  local_4 = zng_inflateInit2(&local_70);
  local_70.avail_in = 2;
  local_70.next_in = "c";
  local_70.avail_out = 1;
  local_70.next_out = (uint8_t *)&local_4;
  memset(auStackY_1e8,0,0x101);
  local_4 = zng_inflateSetDictionary(&local_70,auStackY_1e8,0x101);
  if (local_4 != 0) {
    __assert_fail("ret == Z_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x1a4,"void cover_wrap(void)");
  }
  mem_limit(&local_70,0x4900);
  local_4 = zng_inflatePrime(&local_70,0x10,0);
  if (local_4 != 0) {
    __assert_fail("ret == Z_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x1a6,"void cover_wrap(void)");
  }
  local_70.avail_in = 2;
  local_70.next_in = (uint8_t *)anon_var_dwarf_455;
  local_4 = zng_inflateSync(&local_70);
  if (local_4 != -3) {
    __assert_fail("ret == Z_DATA_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x1a9,"void cover_wrap(void)");
  }
  local_4 = zng_inflate(&local_70,0);
  if (local_4 != -2) {
    __assert_fail("ret == Z_STREAM_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x1aa,"void cover_wrap(void)");
  }
  local_70.avail_in = 4;
  local_70.next_in = "";
  local_4 = zng_inflateSync(&local_70);
  if (local_4 == 0) {
    zng_inflateSyncPoint(&local_70);
    local_4 = zng_inflateCopy(local_d8,&local_70);
    if (local_4 != -4) {
      __assert_fail("ret == Z_MEM_ERROR",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                    ,0x1af,"void cover_wrap(void)");
    }
    mem_limit(&local_70,0);
    local_4 = zng_inflateUndermine(&local_70,1);
    if (local_4 == -3) {
      zng_inflateMark(&local_70);
      local_4 = zng_inflateEnd(&local_70);
      if (local_4 == 0) {
        mem_done(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        return;
      }
      __assert_fail("ret == Z_OK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                    ,0x1b8,"void cover_wrap(void)");
    }
    __assert_fail("ret == Z_DATA_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                  ,0x1b5,"void cover_wrap(void)");
  }
  __assert_fail("ret == Z_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/infcover.c"
                ,0x1ad,"void cover_wrap(void)");
}

Assistant:

static void cover_wrap(void) {
    int ret;
    PREFIX3(stream) strm, copy;
    unsigned char dict[257];

    ret = PREFIX(inflate)(NULL, 0);             assert(ret == Z_STREAM_ERROR);
    ret = PREFIX(inflateEnd)(NULL);             assert(ret == Z_STREAM_ERROR);
    ret = PREFIX(inflateCopy)(NULL, NULL);      assert(ret == Z_STREAM_ERROR);
    fputs("inflate bad parameters\n", stderr);

    inf("1f 8b 0 0", "bad gzip method", 0, 31, 0, Z_DATA_ERROR);
    inf("1f 8b 8 80", "bad gzip flags", 0, 31, 0, Z_DATA_ERROR);
    inf("77 85", "bad zlib method", 0, 15, 0, Z_DATA_ERROR);
    inf("8 99", "set window size from header", 0, 0, 0, Z_OK);
    inf("78 9c", "bad zlib window size", 0, 8, 0, Z_DATA_ERROR);
    inf("78 9c 63 0 0 0 1 0 1", "check adler32", 0, 15, 1, Z_STREAM_END);
    inf("1f 8b 8 1e 0 0 0 0 0 0 1 0 0 0 0 0 0", "bad header crc", 0, 47, 1,
        Z_DATA_ERROR);
    inf("1f 8b 8 2 0 0 0 0 0 0 1d 26 3 0 0 0 0 0 0 0 0 0", "check gzip length",
        0, 47, 0, Z_STREAM_END);
    inf("78 90", "bad zlib header check", 0, 47, 0, Z_DATA_ERROR);
    inf("8 b8 0 0 0 1", "need dictionary", 0, 8, 0, Z_NEED_DICT);
    inf("78 9c 63 0", "compute adler32", 0, 15, 1, Z_OK);

    mem_setup(&strm);
    strm.avail_in = 0;
    strm.next_in = NULL;
    ret = PREFIX(inflateInit2)(&strm, -8);
    strm.avail_in = 2;
    strm.next_in = (void *)"\x63";
    strm.avail_out = 1;
    strm.next_out = (void *)&ret;
    memset(dict, 0, 257);
    ret = PREFIX(inflateSetDictionary)(&strm, dict, 257);
                                                assert(ret == Z_OK);
    mem_limit(&strm, (sizeof(struct inflate_state) << 1) + 256);
    ret = PREFIX(inflatePrime)(&strm, 16, 0);   assert(ret == Z_OK);
    strm.avail_in = 2;
    strm.next_in = (void *)"\x80";
    ret = PREFIX(inflateSync)(&strm);           assert(ret == Z_DATA_ERROR);
    ret = PREFIX(inflate)(&strm, Z_NO_FLUSH);   assert(ret == Z_STREAM_ERROR);
    strm.avail_in = 4;
    strm.next_in = (void *)"\0\0\xff\xff";
    ret = PREFIX(inflateSync)(&strm);           assert(ret == Z_OK);
    (void)PREFIX(inflateSyncPoint)(&strm);
    ret = PREFIX(inflateCopy)(&copy, &strm);    assert(ret == Z_MEM_ERROR);
    mem_limit(&strm, 0);
    ret = PREFIX(inflateUndermine)(&strm, 1);
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
    assert(ret == Z_OK);
#else
    assert(ret == Z_DATA_ERROR);
#endif
    (void)PREFIX(inflateMark)(&strm);
    ret = PREFIX(inflateEnd)(&strm);            assert(ret == Z_OK);
    mem_done(&strm, "miscellaneous, force memory errors");
}